

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int deflate(z_streamp strm,int flush)

{
  Bytef *pBVar1;
  uint uVar2;
  deflate_state *s;
  Bytef *pBVar3;
  ulg uVar4;
  Posf *__s;
  long lVar5;
  Bytef BVar6;
  int iVar7;
  uint uVar8;
  block_state bVar9;
  uLong uVar10;
  gz_headerp pgVar11;
  uInt uVar12;
  ulg uVar13;
  ulong uVar14;
  uInt uVar15;
  Bytef *pBVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long local_48;
  int local_40;
  
  iVar7 = deflateStateCheck(strm);
  if (5 < (uint)flush) {
    return -2;
  }
  if (iVar7 != 0) {
    return -2;
  }
  if (strm->next_out == (Bytef *)0x0) {
LAB_0028f1cb:
    strm->msg = "stream error";
    return -2;
  }
  s = strm->state;
  uVar15 = strm->avail_in;
  if (((uVar15 != 0) && (strm->next_in == (Bytef *)0x0)) ||
     (iVar7 = s->status, flush != 4 && iVar7 == 0x29a)) goto LAB_0028f1cb;
  if (strm->avail_out == 0) {
LAB_0028f2a0:
    strm->msg = "buffer error";
    return -5;
  }
  iVar20 = s->last_flush;
  s->last_flush = flush;
  if (s->pending == 0) {
    if (uVar15 == 0) {
      if ((flush != 4) &&
         ((int)((uint)((uint)flush < 5) * 9 + flush * 2 + -9) <=
          (int)((uint)(iVar20 < 5) * 9 + iVar20 * 2 + -9))) goto LAB_0028f2a0;
    }
  }
  else {
    flush_pending(strm);
    if (strm->avail_out == 0) goto LAB_0028f913;
    iVar7 = s->status;
  }
  if (iVar7 == 0x2a) {
    uVar8 = s->w_bits * 0x1000 - 0x7800;
    uVar21 = 0;
    if ((s->strategy < 2) && (uVar2 = s->level, 1 < (int)uVar2)) {
      if (uVar2 < 6) {
        uVar21 = 0x40;
      }
      else {
        uVar21 = (uVar2 != 6 | 2) << 6;
      }
    }
    uVar2 = uVar21 + 0x20 + uVar8;
    if (s->strstart == 0) {
      uVar2 = uVar21 | uVar8;
    }
    putShortMSB(s,(uVar2 | uVar2 % 0x1f) ^ 0x1f);
    if (s->strstart != 0) {
      putShortMSB(s,*(uInt *)((long)&strm->adler + 2));
      putShortMSB(s,(uint)(ushort)strm->adler);
    }
    uVar10 = adler32(0,(Bytef *)0x0,0);
    strm->adler = uVar10;
    s->status = 0x71;
    flush_pending(strm);
    if (s->pending != 0) goto LAB_0028f337;
    iVar7 = s->status;
LAB_0028f345:
    if (iVar7 == 0x39) {
      uVar10 = crc32(0,(uchar *)0x0,0);
      strm->adler = uVar10;
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = '\x1f';
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = 0x8b;
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = '\b';
      pgVar11 = s->gzhead;
      if (pgVar11 == (gz_headerp)0x0) {
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = '\0';
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = '\0';
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = '\0';
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = '\0';
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = '\0';
        BVar6 = '\x02';
        if (s->level != 9) {
          BVar6 = (s->level < 2 || 1 < s->strategy) << 2;
        }
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = BVar6;
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = '\x03';
        s->status = 0x71;
        flush_pending(strm);
        if (s->pending != 0) goto LAB_0028f913;
        iVar7 = s->status;
        goto LAB_0028f5e1;
      }
      iVar7 = pgVar11->text;
      iVar20 = pgVar11->hcrc;
      pBVar16 = pgVar11->extra;
      pBVar1 = pgVar11->name;
      pBVar3 = pgVar11->comment;
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] =
           (pBVar3 != (Bytef *)0x0) << 4 |
           (pBVar1 != (Bytef *)0x0) << 3 |
           (pBVar16 != (Bytef *)0x0) << 2 | (iVar20 != 0) * '\x02' | iVar7 != 0;
      uVar10 = s->gzhead->time;
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = (Bytef)uVar10;
      BVar6 = *(Bytef *)((long)&s->gzhead->time + 1);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      BVar6 = *(Bytef *)((long)&s->gzhead->time + 2);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      BVar6 = *(Bytef *)((long)&s->gzhead->time + 3);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      BVar6 = '\x02';
      if (s->level != 9) {
        BVar6 = (s->level < 2 || 1 < s->strategy) << 2;
      }
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      iVar7 = s->gzhead->os;
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = (Bytef)iVar7;
      pgVar11 = s->gzhead;
      if (pgVar11->extra != (Bytef *)0x0) {
        uVar15 = pgVar11->extra_len;
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = (Bytef)uVar15;
        BVar6 = *(Bytef *)((long)&s->gzhead->extra_len + 1);
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = BVar6;
        pgVar11 = s->gzhead;
      }
      if (pgVar11->hcrc != 0) {
        uVar10 = crc32(strm->adler,s->pending_buf,(uInt)s->pending);
        strm->adler = uVar10;
      }
      s->gzindex = 0;
      s->status = 0x45;
LAB_0028f605:
      if (s->gzhead->extra != (Bytef *)0x0) {
        uVar13 = s->pending;
        uVar8 = (uint)(ushort)s->gzhead->extra_len - (int)s->gzindex;
        do {
          uVar25 = (ulong)uVar8;
          if (uVar25 + uVar13 <= s->pending_buf_size) {
            memcpy(s->pending_buf + uVar13,s->gzhead->extra + s->gzindex,uVar25);
            uVar25 = uVar25 + s->pending;
            s->pending = uVar25;
            if ((s->gzhead->hcrc != 0) && (uVar13 < uVar25)) {
              uVar10 = crc32(strm->adler,s->pending_buf + uVar13,(int)uVar25 - (int)uVar13);
              strm->adler = uVar10;
            }
            s->gzindex = 0;
            goto LAB_0028f707;
          }
          uVar14 = s->pending_buf_size - uVar13;
          uVar17 = uVar14 & 0xffffffff;
          memcpy(s->pending_buf + uVar13,s->gzhead->extra + s->gzindex,uVar17);
          uVar25 = s->pending_buf_size;
          s->pending = uVar25;
          if (uVar13 < uVar25 && s->gzhead->hcrc != 0) {
            uVar10 = crc32(strm->adler,s->pending_buf + uVar13,(int)uVar25 - (int)uVar13);
            strm->adler = uVar10;
          }
          s->gzindex = s->gzindex + uVar17;
          flush_pending(strm);
          uVar8 = uVar8 - (int)uVar14;
          uVar13 = 0;
        } while (s->pending == 0);
        goto LAB_0028f913;
      }
LAB_0028f707:
      s->status = 0x49;
LAB_0028f70f:
      if (s->gzhead->name != (Bytef *)0x0) {
        uVar13 = s->pending;
        do {
          uVar25 = s->pending;
          pgVar11 = s->gzhead;
          if (uVar25 == s->pending_buf_size) {
            if (uVar13 < uVar25 && pgVar11->hcrc != 0) {
              uVar10 = crc32(strm->adler,s->pending_buf + uVar13,(int)uVar25 - (int)uVar13);
              strm->adler = uVar10;
            }
            flush_pending(strm);
            if (s->pending != 0) goto LAB_0028f913;
            pgVar11 = s->gzhead;
            uVar25 = 0;
            uVar13 = 0;
          }
          pBVar16 = pgVar11->name;
          uVar4 = s->gzindex;
          s->gzindex = uVar4 + 1;
          BVar6 = pBVar16[uVar4];
          s->pending = uVar25 + 1;
          s->pending_buf[uVar25] = BVar6;
        } while (BVar6 != '\0');
        if ((s->gzhead->hcrc != 0) && (uVar13 < s->pending)) {
          uVar10 = crc32(strm->adler,s->pending_buf + uVar13,(int)s->pending - (int)uVar13);
          strm->adler = uVar10;
        }
        s->gzindex = 0;
      }
      s->status = 0x5b;
LAB_0028f7d4:
      if (s->gzhead->comment != (Bytef *)0x0) {
        uVar13 = s->pending;
        do {
          uVar25 = s->pending;
          pgVar11 = s->gzhead;
          if (uVar25 == s->pending_buf_size) {
            if (uVar13 < uVar25 && pgVar11->hcrc != 0) {
              uVar10 = crc32(strm->adler,s->pending_buf + uVar13,(int)uVar25 - (int)uVar13);
              strm->adler = uVar10;
            }
            flush_pending(strm);
            if (s->pending != 0) goto LAB_0028f913;
            pgVar11 = s->gzhead;
            uVar25 = 0;
            uVar13 = 0;
          }
          pBVar16 = pgVar11->comment;
          uVar4 = s->gzindex;
          s->gzindex = uVar4 + 1;
          BVar6 = pBVar16[uVar4];
          s->pending = uVar25 + 1;
          s->pending_buf[uVar25] = BVar6;
        } while (BVar6 != '\0');
        if ((s->gzhead->hcrc != 0) && (uVar13 < s->pending)) {
          uVar10 = crc32(strm->adler,s->pending_buf + uVar13,(int)s->pending - (int)uVar13);
          strm->adler = uVar10;
        }
      }
      s->status = 0x67;
LAB_0028f894:
      if (s->gzhead->hcrc != 0) {
        uVar13 = s->pending;
        if (s->pending_buf_size < uVar13 + 2) {
          flush_pending(strm);
          uVar13 = 0;
          if (s->pending != 0) goto LAB_0028f337;
        }
        uVar10 = strm->adler;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = (Bytef)uVar10;
        BVar6 = *(Bytef *)((long)&strm->adler + 1);
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = BVar6;
        uVar10 = crc32(0,(uchar *)0x0,0);
        strm->adler = uVar10;
      }
      s->status = 0x71;
      flush_pending(strm);
      if (s->pending != 0) goto LAB_0028f913;
    }
    else {
LAB_0028f5e1:
      if (iVar7 == 0x67) goto LAB_0028f894;
      if (iVar7 == 0x49) goto LAB_0028f70f;
      if (iVar7 == 0x5b) goto LAB_0028f7d4;
      if (iVar7 == 0x45) goto LAB_0028f605;
    }
    if (strm->avail_in == 0) goto LAB_0028f926;
  }
  else {
    if (iVar7 != 0x29a) goto LAB_0028f345;
    if (strm->avail_in != 0) goto LAB_0028f2a0;
LAB_0028f926:
    if (s->lookahead == 0) {
      if (flush == 0) {
        return 0;
      }
      if (s->status == 0x29a) goto LAB_0028febc;
    }
  }
  if ((long)s->level == 0) {
    bVar9 = deflate_stored(s,flush);
    goto LAB_0028fe23;
  }
  if (s->strategy == 3) {
    do {
      do {
        uVar8 = s->lookahead;
        if (uVar8 < 0x103) {
          fill_window(s);
          uVar8 = s->lookahead;
          if (flush == 0 && uVar8 < 0x103) goto LAB_0029000e;
          if (uVar8 == 0) goto LAB_0028fda2;
          s->match_length = 0;
          uVar15 = s->strstart;
          if (2 < uVar8) goto LAB_0028fadc;
          pBVar16 = s->window;
LAB_0028fbe0:
          uVar12 = s->last_lit;
          uVar25 = (ulong)uVar15;
LAB_0028fbe9:
          bVar19 = pBVar16[uVar25];
          s->d_buf[uVar12] = 0;
          s->last_lit = uVar12 + 1;
          s->l_buf[uVar12] = bVar19;
          s->dyn_ltree[bVar19].fc.freq = s->dyn_ltree[bVar19].fc.freq + 1;
          uVar15 = s->last_lit;
          uVar12 = s->lit_bufsize;
          s->lookahead = s->lookahead - 1;
          uVar8 = s->strstart + 1;
        }
        else {
          s->match_length = 0;
          uVar15 = s->strstart;
LAB_0028fadc:
          pBVar16 = s->window;
          if (uVar15 == 0) {
            uVar15 = 0;
            goto LAB_0028fbe0;
          }
          uVar25 = (ulong)uVar15;
          BVar6 = pBVar16[uVar25 - 1];
          if (((BVar6 != pBVar16[uVar25]) || (pBVar1 = pBVar16 + uVar25, BVar6 != pBVar1[1])) ||
             (BVar6 != pBVar1[2])) goto LAB_0028fbe0;
          local_40 = (int)pBVar1 + 0x102;
          lVar22 = uVar25 + 2;
          local_48 = uVar25 + 4;
          lVar23 = uVar25 + 5;
          lVar24 = uVar25 + 6;
          lVar27 = uVar25 + 7;
          lVar26 = uVar25 + 9;
          uVar17 = 2;
          lVar18 = uVar25 + 3;
          uVar14 = uVar25;
          do {
            uVar14 = uVar14 + 8;
            iVar7 = (int)pBVar16;
            if (BVar6 != pBVar16[lVar18]) {
              iVar20 = (int)lVar18 + iVar7;
              goto LAB_0028fccb;
            }
            if (BVar6 != pBVar16[lVar18 + 1]) {
              iVar20 = (int)local_48;
              break;
            }
            if (BVar6 != pBVar16[lVar18 + 2]) {
              iVar20 = (int)lVar23 + iVar7;
              goto LAB_0028fccb;
            }
            if (BVar6 != pBVar16[lVar18 + 3]) {
              iVar20 = (int)lVar24 + iVar7;
              goto LAB_0028fccb;
            }
            if (BVar6 != pBVar16[lVar18 + 4]) {
              iVar20 = (int)lVar27 + iVar7;
              goto LAB_0028fccb;
            }
            if (BVar6 != pBVar16[lVar18 + 5]) {
              iVar20 = (int)uVar14 + iVar7;
              goto LAB_0028fccb;
            }
            if (BVar6 != pBVar16[lVar18 + 6]) {
              iVar20 = (int)lVar26 + iVar7;
              goto LAB_0028fccb;
            }
            lVar22 = lVar22 + 8;
            iVar20 = (int)lVar22;
            if (0xf9 < uVar17) break;
            uVar17 = uVar17 + 8;
            local_48 = local_48 + 8;
            lVar23 = lVar23 + 8;
            lVar24 = lVar24 + 8;
            lVar27 = lVar27 + 8;
            lVar26 = lVar26 + 8;
            lVar5 = lVar18 + 7;
            lVar18 = lVar18 + 8;
          } while (BVar6 == pBVar16[lVar5]);
          iVar20 = iVar20 + iVar7;
LAB_0028fccb:
          uVar21 = (iVar20 - local_40) + 0x102;
          if (uVar8 <= uVar21) {
            uVar21 = uVar8;
          }
          s->match_length = uVar21;
          uVar12 = s->last_lit;
          if (uVar21 < 3) goto LAB_0028fbe9;
          bVar19 = (char)uVar21 - 3;
          s->d_buf[uVar12] = 1;
          s->last_lit = uVar12 + 1;
          s->l_buf[uVar12] = bVar19;
          s->dyn_ltree[(ulong)""[bVar19] + 0x101].fc.freq =
               s->dyn_ltree[(ulong)""[bVar19] + 0x101].fc.freq + 1;
          s->dyn_dtree[0].fc.freq = s->dyn_dtree[0].fc.freq + 1;
          uVar15 = s->last_lit;
          uVar12 = s->lit_bufsize;
          s->lookahead = s->lookahead - s->match_length;
          uVar8 = s->match_length + s->strstart;
          s->match_length = 0;
        }
        s->strstart = uVar8;
      } while (uVar15 != uVar12 - 1);
      uVar25 = s->block_start;
      if ((long)uVar25 < 0) {
        pBVar16 = (Bytef *)0x0;
      }
      else {
        pBVar16 = s->window + (uVar25 & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)pBVar16,uVar8 - uVar25,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
    } while (s->strm->avail_out != 0);
  }
  else {
    if (s->strategy != 2) {
      bVar9 = (*configuration_table[s->level].func)(s,flush);
      goto LAB_0028fe23;
    }
    do {
      do {
        if ((s->lookahead == 0) && (fill_window(s), s->lookahead == 0)) {
          if (flush != 0) goto LAB_0028fda2;
          goto LAB_0029000e;
        }
        s->match_length = 0;
        bVar19 = s->window[s->strstart];
        uVar8 = s->last_lit;
        s->d_buf[uVar8] = 0;
        s->last_lit = uVar8 + 1;
        s->l_buf[uVar8] = bVar19;
        s->dyn_ltree[bVar19].fc.freq = s->dyn_ltree[bVar19].fc.freq + 1;
        s->lookahead = s->lookahead - 1;
        uVar8 = s->strstart + 1;
        s->strstart = uVar8;
      } while (s->last_lit != s->lit_bufsize - 1);
      uVar25 = s->block_start;
      if ((long)uVar25 < 0) {
        pBVar16 = (Bytef *)0x0;
      }
      else {
        pBVar16 = s->window + (uVar25 & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)pBVar16,uVar8 - uVar25,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
    } while (s->strm->avail_out != 0);
  }
LAB_0029000e:
  if (strm->avail_out != 0) {
    return 0;
  }
LAB_0028f337:
  s->last_flush = -1;
  return 0;
LAB_0028fda2:
  s->insert = 0;
  if (flush == 4) {
    uVar25 = s->block_start;
    if ((long)uVar25 < 0) {
      pBVar16 = (Bytef *)0x0;
    }
    else {
      pBVar16 = s->window + (uVar25 & 0xffffffff);
    }
    _tr_flush_block(s,(charf *)pBVar16,s->strstart - uVar25,1);
    s->block_start = (ulong)s->strstart;
    flush_pending(s->strm);
    bVar9 = finish_done - (s->strm->avail_out == 0);
LAB_0028fe23:
    if ((bVar9 & ~block_done) == finish_started) {
      s->status = 0x29a;
    }
    if ((bVar9 & ~finish_started) == need_more) goto LAB_0029000e;
    if (bVar9 != block_done) goto LAB_0028febc;
  }
  else if (s->last_lit != 0) {
    uVar25 = s->block_start;
    if ((long)uVar25 < 0) {
      pBVar16 = (Bytef *)0x0;
    }
    else {
      pBVar16 = s->window + (uVar25 & 0xffffffff);
    }
    _tr_flush_block(s,(charf *)pBVar16,s->strstart - uVar25,0);
    s->block_start = (ulong)s->strstart;
    flush_pending(s->strm);
    if (s->strm->avail_out == 0) goto LAB_0029000e;
  }
  if (flush != 5) {
    if (flush == 1) {
      _tr_align(s);
    }
    else {
      _tr_stored_block(s,(charf *)0x0,0,0);
      if (flush == 3) {
        __s = s->head;
        uVar25 = (ulong)(s->hash_size - 1);
        __s[uVar25] = 0;
        memset(__s,0,uVar25 * 2);
        if (s->lookahead == 0) {
          s->strstart = 0;
          s->block_start = 0;
          s->insert = 0;
        }
      }
    }
  }
  flush_pending(strm);
  if (strm->avail_out == 0) {
LAB_0028f913:
    s->last_flush = -1;
    return 0;
  }
LAB_0028febc:
  if (flush != 4) {
    return 0;
  }
  if (0 < s->wrap) {
    uVar10 = strm->adler;
    if (s->wrap == 2) {
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = (Bytef)uVar10;
      BVar6 = *(Bytef *)((long)&strm->adler + 1);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      BVar6 = *(Bytef *)((long)&strm->adler + 2);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      BVar6 = *(Bytef *)((long)&strm->adler + 3);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      uVar10 = strm->total_in;
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = (Bytef)uVar10;
      BVar6 = *(Bytef *)((long)&strm->total_in + 1);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      BVar6 = *(Bytef *)((long)&strm->total_in + 2);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      BVar6 = *(Bytef *)((long)&strm->total_in + 3);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
    }
    else {
      putShortMSB(s,(uInt)(uVar10 >> 0x10));
      putShortMSB(s,(uint)(ushort)strm->adler);
    }
    flush_pending(strm);
    if (0 < s->wrap) {
      s->wrap = -s->wrap;
    }
    return (uint)(s->pending == 0);
  }
  return 1;
}

Assistant:

int ZEXPORT deflate (strm, flush)
    z_streamp strm;
    int flush;
{
    int old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (deflateStateCheck(strm) || flush > Z_BLOCK || flush < 0) {
        return Z_STREAM_ERROR;
    }
    s = strm->state;

    if (strm->next_out == Z_NULL ||
        (strm->avail_in != 0 && strm->next_in == Z_NULL) ||
        (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) ERR_RETURN(strm, Z_BUF_ERROR);

    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        flush_pending(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

    /* Make sure there is something to do and avoid duplicate consecutive
     * flushes. For repeated and useless calls with Z_FINISH, we keep
     * returning Z_STREAM_END instead of Z_BUF_ERROR.
     */
    } else if (strm->avail_in == 0 && RANK(flush) <= RANK(old_flush) &&
               flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Write the header */
    if (s->status == INIT_STATE) {
        /* zlib header */
        uInt header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
        uInt level_flags;

        if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
            level_flags = 0;
        else if (s->level < 6)
            level_flags = 1;
        else if (s->level == 6)
            level_flags = 2;
        else
            level_flags = 3;
        header |= (level_flags << 6);
        if (s->strstart != 0) header |= PRESET_DICT;
        header += 31 - (header % 31);

        putShortMSB(s, header);

        /* Save the adler32 of the preset dictionary: */
        if (s->strstart != 0) {
            putShortMSB(s, (uInt)(strm->adler >> 16));
            putShortMSB(s, (uInt)(strm->adler & 0xffff));
        }
        strm->adler = adler32(0L, Z_NULL, 0);
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        flush_pending(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#ifdef GZIP
    if (s->status == GZIP_STATE) {
        /* gzip header */
        strm->adler = crc32(0L, Z_NULL, 0);
        put_byte(s, 31);
        put_byte(s, 139);
        put_byte(s, 8);
        if (s->gzhead == Z_NULL) {
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, s->level == 9 ? 2 :
                     (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                      4 : 0));
            put_byte(s, OS_CODE);
            s->status = BUSY_STATE;

            /* Compression must start with an empty pending buffer */
            flush_pending(strm);
            if (s->pending != 0) {
                s->last_flush = -1;
                return Z_OK;
            }
        }
        else {
            put_byte(s, (s->gzhead->text ? 1 : 0) +
                     (s->gzhead->hcrc ? 2 : 0) +
                     (s->gzhead->extra == Z_NULL ? 0 : 4) +
                     (s->gzhead->name == Z_NULL ? 0 : 8) +
                     (s->gzhead->comment == Z_NULL ? 0 : 16)
                     );
            put_byte(s, (Byte)(s->gzhead->time & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 8) & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 16) & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 24) & 0xff));
            put_byte(s, s->level == 9 ? 2 :
                     (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                      4 : 0));
            put_byte(s, s->gzhead->os & 0xff);
            if (s->gzhead->extra != Z_NULL) {
                put_byte(s, s->gzhead->extra_len & 0xff);
                put_byte(s, (s->gzhead->extra_len >> 8) & 0xff);
            }
            if (s->gzhead->hcrc)
                strm->adler = crc32(strm->adler, s->pending_buf,
                                    s->pending);
            s->gzindex = 0;
            s->status = EXTRA_STATE;
        }
    }
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            uInt left = (s->gzhead->extra_len & 0xffff) - s->gzindex;
            while (s->pending + left > s->pending_buf_size) {
                uInt copy = s->pending_buf_size - s->pending;
                zmemcpy(s->pending_buf + s->pending,
                        s->gzhead->extra + s->gzindex, copy);
                s->pending = s->pending_buf_size;
                HCRC_UPDATE(beg);
                s->gzindex += copy;
                flush_pending(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
                beg = 0;
                left -= copy;
            }
            zmemcpy(s->pending_buf + s->pending,
                    s->gzhead->extra + s->gzindex, left);
            s->pending += left;
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            int val;
            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    flush_pending(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            int val;
            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    flush_pending(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
        }
        s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size) {
                flush_pending(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
            }
            put_byte(s, (Byte)(strm->adler & 0xff));
            put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
            strm->adler = crc32(0L, Z_NULL, 0);
        }
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        flush_pending(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#endif

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 ||
        (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = s->level == 0 ? deflate_stored(s, flush) :
                 s->strategy == Z_HUFFMAN_ONLY ? deflate_huff(s, flush) :
                 s->strategy == Z_RLE ? deflate_rle(s, flush) :
                 (*(configuration_table[s->level].func))(s, flush);

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                _tr_align(s);
            } else if (flush != Z_BLOCK) { /* FULL_FLUSH or SYNC_FLUSH */
                _tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                    if (s->lookahead == 0) {
                        s->strstart = 0;
                        s->block_start = 0L;
                        s->insert = 0;
                    }
                }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
              return Z_OK;
            }
        }
    }

    if (flush != Z_FINISH) return Z_OK;
    if (s->wrap <= 0) return Z_STREAM_END;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        put_byte(s, (Byte)(strm->adler & 0xff));
        put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 16) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 24) & 0xff));
        put_byte(s, (Byte)(strm->total_in & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 8) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 16) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 24) & 0xff));
    }
    else
#endif
    {
        putShortMSB(s, (uInt)(strm->adler >> 16));
        putShortMSB(s, (uInt)(strm->adler & 0xffff));
    }
    flush_pending(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0) s->wrap = -s->wrap; /* write the trailer only once! */
    return s->pending != 0 ? Z_OK : Z_STREAM_END;
}